

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::
TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
::TupleImpl<capnp::Orphan<capnp::compiler::LocatedInteger>,bool,bool>
          (TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
           *this,Tuple<capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *other)

{
  TypeByIndex<0UL,_capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *t;
  Orphan<capnp::compiler::LocatedInteger> *t_00;
  TypeByIndex<1UL,_capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *t_01;
  bool *pbVar1;
  TypeByIndex<2UL,_capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *t_02;
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> local_40;
  Tuple<capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *local_18;
  Tuple<capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *other_local;
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>
  *this_local;
  
  local_18 = other;
  other_local = (Tuple<capnp::Orphan<capnp::compiler::LocatedInteger>,_bool,_bool> *)this;
  t = getImpl<0ul,capnp::Orphan<capnp::compiler::LocatedInteger>,bool,bool>(other);
  t_00 = fwd<capnp::Orphan<capnp::compiler::LocatedInteger>>(t);
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe(&local_40,t_00);
  TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>::TupleElement
            ((TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_> *)this,
             &local_40);
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::~Maybe(&local_40);
  t_01 = getImpl<1ul,capnp::Orphan<capnp::compiler::LocatedInteger>,bool,bool>(local_18);
  pbVar1 = fwd<bool>(t_01);
  TupleElement<1U,_bool>::TupleElement((TupleElement<1U,_bool> *)(this + 0x28),pbVar1);
  t_02 = getImpl<2ul,capnp::Orphan<capnp::compiler::LocatedInteger>,bool,bool>(local_18);
  pbVar1 = fwd<bool>(t_02);
  TupleElement<2U,_bool>::TupleElement((TupleElement<2U,_bool> *)(this + 0x29),pbVar1);
  return;
}

Assistant:

constexpr inline TupleImpl(Tuple<U...>&& other)
      : TupleElement<indexes, Types>(kj::fwd<U>(getImpl<indexes>(other)))... {}